

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

void __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::optimizeConstantPointer
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this)

{
  ulong uVar1;
  Expression *pEVar2;
  Literal *this_00;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  Literal local_30;
  
  uVar1 = (this->curr->offset).addr;
  if (uVar1 != 0) {
    pEVar2 = this->curr->ptr;
    if (pEVar2->_id != ConstId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
    }
    this_00 = (Literal *)(pEVar2 + 1);
    if (this->memory64 == true) {
      if (*(long *)(pEVar2 + 2) != 3) {
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x129,"int64_t wasm::Literal::geti64() const");
      }
      if (CARRY8((this_00->field_0).func.super_IString.str._M_len,uVar1)) {
        return;
      }
      local_38 = 3;
      local_48.func.super_IString.str._M_len = uVar1;
      Literal::add(&local_30,this_00,(Literal *)&local_48.func);
      Literal::operator=(this_00,&local_30);
    }
    else {
      if (*(long *)(pEVar2 + 2) != 2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      if ((uVar1 & 0xffffffff) + (ulong)(uint)(this_00->field_0).i32 >> 0x20 != 0) {
        return;
      }
      local_48.i32 = (int)uVar1;
      local_38 = 2;
      Literal::add(&local_30,this_00,(Literal *)&local_48.func);
      Literal::operator=(this_00,&local_30);
    }
    Literal::~Literal(&local_30);
    Literal::~Literal((Literal *)&local_48.func);
    (this->curr->offset).addr = 0;
  }
  return;
}

Assistant:

void optimizeConstantPointer() {
    // The constant and an offset are interchangeable:
    //   (load (const X))  <=>  (load offset=X (const 0))
    // It may not matter if we do this or not - it's the same size,
    // and in both cases the compiler can see it's a constant location.
    // For code clarity and compressibility, we prefer to put the
    // entire address in the constant.
    if (curr->offset) {
      // Note that the offset may already be larger than low memory - the
      // code may know that is valid, even if we can't. Only handle the
      // obviously valid case where an overflow can't occur.
      auto* c = curr->ptr->template cast<Const>();
      if (memory64) {
        uint64_t base = c->value.geti64();
        uint64_t offset = curr->offset;

        uint64_t max = std::numeric_limits<uint64_t>::max();
        bool overflow = (base > max - offset);
        if (!overflow) {
          c->value = c->value.add(Literal(offset));
          curr->offset = 0;
        }
      } else {
        uint32_t base = c->value.geti32();
        uint32_t offset = curr->offset;
        if (uint64_t(base) + uint64_t(offset) < (uint64_t(1) << 32)) {
          c->value = c->value.add(Literal(uint32_t(curr->offset)));
          curr->offset = 0;
        }
      }
    }
  }